

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::configureAttribute
          (LimitTest *this,_iteration iteration,attributeConfiguration *configuration,GLint n_type,
          GLuint program_id,bool use_arrays,bool use_vertex_array)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  glGetAttribLocationFunc p_Var4;
  int iVar5;
  GLint GVar6;
  int iVar7;
  int iVar8;
  GLuint GVar9;
  GLenum GVar10;
  int iVar11;
  ulong uVar12;
  ostream *poVar13;
  TestError *this_01;
  int iVar14;
  int iVar15;
  int iVar16;
  GLuint GVar17;
  int iVar18;
  ulong uVar19;
  GLint column;
  int iVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  int local_378;
  string local_358 [32];
  stringstream attribute_name;
  ostream local_328;
  undefined1 local_1b0 [384];
  
  iVar8 = configuration->m_n_attributes_per_group;
  iVar5 = iVar8 * n_type;
  GVar6 = calculateAttributeGroupOffset(this,configuration,n_type);
  iVar1 = configuration->m_n_elements[n_type];
  iVar2 = configuration->m_n_rows[n_type];
  uVar19 = (long)iVar1 / (long)iVar2;
  uVar12 = uVar19 & 0xffffffff;
  iVar3 = configuration->m_vertex_length;
  iVar14 = 0;
  if ((int)uVar19 < 1) {
    uVar12 = 0;
  }
  iVar7 = (iVar8 + 1) * n_type;
  do {
    if (iVar8 <= iVar14) {
      return;
    }
    iVar8 = iVar5 + iVar14;
    std::__cxx11::stringstream::stringstream((stringstream *)&attribute_name);
    if (use_arrays) {
      poVar13 = std::operator<<(&local_328,"attribute_");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,n_type);
      poVar13 = std::operator<<(poVar13,"[");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar14);
      std::operator<<(poVar13,"]");
    }
    else {
      poVar13 = std::operator<<(&local_328,"attribute_");
      std::ostream::operator<<(poVar13,iVar8);
    }
    p_Var4 = (this->super_Base).gl.getAttribLocation;
    std::__cxx11::stringbuf::str();
    GVar9 = (*p_Var4)(program_id,(GLchar *)local_1b0._0_8_);
    std::__cxx11::string::~string((string *)local_1b0);
    GVar10 = (*(this->super_Base).gl.getError)();
    glu::checkError(GVar10,"GetAttribLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x695);
    if (GVar9 == 0xffffffff) {
      local_1b0._0_8_ = (this->super_Base).m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"GetAttribLocation(");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,", ");
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)this_00,local_358);
      std::operator<<((ostream *)this_00,") returned: ");
      std::ostream::operator<<(this_00,-1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string(local_358);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Inactive attribute",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                 ,0x69c);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar19 = uVar12;
    iVar16 = GVar6;
    if (use_vertex_array) {
      while (uVar19 != 0) {
        (*(this->super_Base).gl.enableVertexAttribArray)(GVar9);
        GVar10 = (*(this->super_Base).gl.getError)();
        glu::checkError(GVar10,"EnableVertexAttribArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                        ,0x6a9);
        (*(this->super_Base).gl.vertexAttribLPointer)
                  (GVar9,iVar2,0x140a,iVar3 << 3,(void *)((long)iVar16 << 3));
        GVar10 = (*(this->super_Base).gl.getError)();
        glu::checkError(GVar10,"VertexAttribLPointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                        ,0x6ae);
        GVar9 = GVar9 + 1;
        uVar19 = uVar19 - 1;
        iVar16 = iVar16 + iVar2;
      }
    }
    else {
      dVar21 = (double)iVar8;
      dVar22 = (double)(iVar8 + 1);
      dVar23 = (double)(iVar8 + 2);
      iVar16 = iVar14;
      iVar15 = iVar14;
      iVar18 = iVar14;
      for (iVar20 = 0; local_378 = (int)uVar12, local_378 != iVar20; iVar20 = iVar20 + 1) {
        if (iteration - DMAT2 < 5) {
          GVar17 = GVar9 + iVar20;
          if (iVar2 == 3) {
            dVar25 = (double)(iVar7 + iVar15 + 1);
            dVar24 = (double)(iVar7 + iVar15);
            dVar26 = (double)(iVar7 + iVar15 + 2);
LAB_00a77888:
            (*(this->super_Base).gl.vertexAttribL3d)(GVar17,dVar24,dVar25,dVar26);
          }
          else if (iVar2 == 2) {
            dVar24 = (double)(iVar7 + iVar16);
            dVar25 = (double)(iVar7 + iVar16 + 1);
LAB_00a7780b:
            (*(this->super_Base).gl.vertexAttribL2d)(GVar17,dVar24,dVar25);
          }
          else {
            dVar24 = (double)(iVar7 + iVar18);
            dVar25 = (double)(iVar7 + iVar18 + 1);
            dVar26 = (double)(iVar7 + iVar18 + 2);
            iVar11 = iVar7 + iVar18;
LAB_00a7789d:
            (*(this->super_Base).gl.vertexAttribL4d)
                      (GVar17,dVar24,dVar25,dVar26,(double)(iVar11 + 3));
          }
        }
        else {
          GVar17 = GVar9;
          if (iteration == DVEC3_DVEC4) {
            dVar24 = dVar21;
            dVar25 = dVar22;
            dVar26 = dVar23;
            iVar11 = iVar8;
            if (iVar2 != 3) goto LAB_00a7789d;
            goto LAB_00a77888;
          }
          if (iteration == DOUBLE_DVEC2) {
            dVar24 = dVar22;
            dVar25 = dVar23;
            if (iVar2 != 1) goto LAB_00a7780b;
            (*(this->super_Base).gl.vertexAttribL1d)(GVar9,dVar21);
          }
        }
        iVar16 = iVar16 + 2;
        iVar15 = iVar15 + 3;
        iVar18 = iVar18 + iVar2;
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&attribute_name);
    iVar14 = iVar14 + 1;
    iVar8 = configuration->m_n_attributes_per_group;
    GVar6 = GVar6 + iVar1;
  } while( true );
}

Assistant:

void LimitTest::configureAttribute(_iteration iteration, const attributeConfiguration& configuration, GLint n_type,
								   GLuint program_id, bool use_arrays, bool use_vertex_array) const
{
	static const GLint invalid_attrib_location = -1;

	const GLint attributes_index = n_type * configuration.m_n_attributes_per_group;
	const GLint group_offset	 = calculateAttributeGroupOffset(configuration, n_type);
	const GLint n_elements		 = configuration.m_n_elements[n_type];
	const GLint n_rows			 = configuration.m_n_rows[n_type];
	const GLint n_columns		 = n_elements / n_rows;
	const GLint vertex_length	= configuration.m_vertex_length;

	/* For each attribute in "n_type" group */
	for (GLint i = 0; i < configuration.m_n_attributes_per_group; ++i)
	{
		const GLint		  attribute_ordinal = i + attributes_index;
		std::stringstream attribute_name;

		/* Separate attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE[INDEX] */
		if (false == use_arrays)
		{
			attribute_name << "attribute_" << attribute_ordinal;
		}
		else
		{
			attribute_name << "attribute_" << n_type << "[" << i << "]";
		}

		/* get location */
		GLint attribute_location = gl.getAttribLocation(program_id, attribute_name.str().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetAttribLocation");

		if (invalid_attrib_location == attribute_location)
		{
			m_log << tcu::TestLog::Message << "GetAttribLocation(" << program_id << ", " << attribute_name.str()
				  << ") returned: " << attribute_location << tcu::TestLog::EndMessage;

			TCU_FAIL("Inactive attribute");
		}

		/* Configure */
		if (true == use_vertex_array)
		{
			/* With vertex array */
			for (GLint column = 0; column < n_columns; ++column)
			{
				const GLint attribute_offset = group_offset + i * n_elements;
				const GLint column_offset	= column * n_rows;

				gl.enableVertexAttribArray(attribute_location + column);
				GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");

				gl.vertexAttribLPointer(attribute_location + column, n_rows /* size */, GL_DOUBLE,
										static_cast<glw::GLsizei>(vertex_length * sizeof(GLdouble)),
										(GLvoid*)((attribute_offset + column_offset) * sizeof(GLdouble)));
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribLPointer");
			}
		}
		else
		{
			/* As constant */
			for (GLint column = 0; column < n_columns; ++column)
			{
				switch (iteration)
				{
				case DOUBLE_DVEC2:

					/* Double attributes should be assigned the value:
					 (n_attribute + gl_VertexID * 2) */
					/* Dvec2 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 3 + 1,
					 n_attribute + gl_VertexID * 3 + 2)*/

					if (1 == n_rows)
					{
						gl.vertexAttribL1d(attribute_location, attribute_ordinal);
					}
					else
					{
						gl.vertexAttribL2d(attribute_location, attribute_ordinal + 1, attribute_ordinal + 2);
					}

					break;

				case DVEC3_DVEC4:

					/* Dvec3 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 3 + 0,
					 n_attribute + gl_VertexID * 3 + 1,
					 n_attribute + gl_VertexID * 3 + 2).

					 Dvec4 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 4 + 0,
					 n_attribute + gl_VertexID * 4 + 1,
					 n_attribute + gl_VertexID * 4 + 2,
					 n_attribute + gl_VertexID * 4 + 3).*/

					if (3 == n_rows)
					{
						gl.vertexAttribL3d(attribute_location, attribute_ordinal + 0, attribute_ordinal + 1,
										   attribute_ordinal + 2);
					}
					else
					{
						gl.vertexAttribL4d(attribute_location, attribute_ordinal + 0, attribute_ordinal + 1,
										   attribute_ordinal + 2, attribute_ordinal + 3);
					}

					break;

				case DMAT2:
				case DMAT3X2_DMAT4X2:
				case DMAT2X3_DMAT2X4:
				case DMAT3_DMAT3X4:
				case DMAT4X3_DMAT4:

					/* Subsequent matrix elements should be assigned the following value:
					 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

					if (2 == n_rows)
					{
						gl.vertexAttribL2d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows);
					}
					else if (3 == n_rows)
					{
						gl.vertexAttribL3d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows,
										   n_type + attribute_ordinal + 2 + column * n_rows);
					}
					else
					{
						gl.vertexAttribL4d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows,
										   n_type + attribute_ordinal + 2 + column * n_rows,
										   n_type + attribute_ordinal + 3 + column * n_rows);
					}

					break;
				}
			}
		}
	}
}